

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram_test.cc
# Opt level: O0

void __thiscall
prometheus::anon_unknown_0::HistogramTest_test_reset_Test::HistogramTest_test_reset_Test
          (HistogramTest_test_reset_Test *this)

{
  HistogramTest_test_reset_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__HistogramTest_test_reset_Test_0026ffc8;
  return;
}

Assistant:

TEST(HistogramTest, test_reset) {
  Histogram histogram{{1, 2}};
  histogram.ObserveMultiple({5, 9, 3}, 20);
  histogram.ObserveMultiple({0, 20, 6}, 34);
  histogram.Reset();
  auto metric = histogram.Collect();
  auto h = metric.histogram;
  EXPECT_EQ(h.sample_count, 0U);
  EXPECT_EQ(h.sample_sum, 0U);
  EXPECT_EQ(h.bucket.at(0).cumulative_count, 0U);
  EXPECT_EQ(h.bucket.at(1).cumulative_count, 0U);
  EXPECT_EQ(h.bucket.at(2).cumulative_count, 0U);
  histogram.ObserveMultiple({5, 9, 3}, 20);
  histogram.ObserveMultiple({0, 20, 6}, 34);
  metric = histogram.Collect();
  h = metric.histogram;
  EXPECT_EQ(h.sample_count, 43U);
  EXPECT_EQ(h.sample_sum, 54);
}